

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

logical pnga_update3_ghosts(Integer g_a)

{
  long lVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  C_Integer *pCVar10;
  global_array_t *pgVar11;
  int _d;
  int iVar12;
  Integer proc;
  logical lVar13;
  long grp_id;
  Integer *map;
  ulong *proclist;
  long lVar14;
  size_t sVar15;
  Integer IVar16;
  ulong uVar17;
  int iVar18;
  logical lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  C_Integer CVar28;
  Integer _last;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long ndim;
  int _ndim;
  ulong uVar32;
  Integer idx;
  long lVar33;
  int local_620;
  int local_618;
  int _index [7];
  Integer _hi [7];
  int stride_rem [7];
  int stride_loc [7];
  int count [7];
  Integer np;
  Integer plo_rem [7];
  char err_string [256];
  Integer width [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer phi_rem [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  Integer plo_loc [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer increment [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar13 = pnga_has_ghosts(g_a);
  lVar19 = 1;
  if (lVar13 != 0) {
    lVar1 = g_a + 1000;
    iVar4 = GA[lVar1].elemsize;
    sVar2 = GA[lVar1].ndim;
    ndim = (long)sVar2;
    iVar5 = GA[lVar1].p_handle;
    grp_id = (long)iVar5;
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    if (0 < ndim) {
      lVar20 = 0;
      do {
        increment[lVar20] = 0;
        width[lVar20] = GA[g_a + 1000].width[lVar20];
        dims[lVar20] = GA[g_a + 1000].dims[lVar20];
        if ((lo_loc[lVar20] == 0) && (hi_loc[lVar20] == -1)) goto LAB_0017ecba;
        lVar20 = lVar20 + 1;
      } while (ndim != lVar20);
    }
    lVar13 = gai_check_ghost_distr(g_a);
    if (lVar13 == 0) {
LAB_0017ecba:
      lVar19 = 0;
    }
    else {
      map = (Integer *)malloc(GAnproc * 0x70 | 8);
      if (map == (Integer *)0x0) {
        pnga_error("pnga_update3_ghosts:malloc failed (_ga_map)",0);
      }
      proclist = (ulong *)malloc(GAnproc << 3);
      if (proclist == (ulong *)0x0) {
        pnga_error("pnga_update3_ghosts:malloc failed (_ga_proclist)",0);
      }
      if (0 < sVar2) {
        local_618 = (int)proc;
        lVar14 = (long)local_618;
        lVar20 = ndim + -1;
        lVar21 = 1;
        if (1 < lVar20) {
          lVar21 = lVar20;
        }
        idx = 0;
        do {
          lVar6 = width[idx];
          if (lVar6 != 0) {
            get_remote_block_neg(idx,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
            lVar13 = pnga_locate_region(g_a,slo_rem,shi_rem,map,(Integer *)proclist,&np);
            if (lVar13 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar15 = strlen(err_string);
              sprintf(err_string + (int)sVar15," [%ld:%ld ",slo_rem[0],shi_rem[0]);
              sVar15 = strlen(err_string);
              iVar18 = (int)sVar15;
              IVar16 = pnga_ndim(g_a);
              if (1 < IVar16) {
                lVar33 = 1;
                do {
                  sprintf(err_string + (int)sVar15,",%ld:%ld ",slo_rem[lVar33],shi_rem[lVar33]);
                  sVar15 = strlen(err_string);
                  iVar18 = (int)sVar15;
                  lVar33 = lVar33 + 1;
                  IVar16 = pnga_ndim(g_a);
                } while (lVar33 < IVar16);
              }
              (err_string + iVar18)[0] = ']';
              (err_string + iVar18)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            uVar31 = *proclist;
            pnga_distribution(g_a,uVar31,tlo_rem,thi_rem);
            pgVar11 = GA;
            lVar33 = 0;
            do {
              if (increment[lVar33] == 0) {
                if (idx == lVar33) {
                  lVar26 = width[lVar33];
                  plo_rem[lVar33] = lVar26 + (thi_rem[lVar33] - tlo_rem[lVar33]) + 1;
                  lVar22 = (thi_rem[lVar33] - tlo_rem[lVar33]) + lVar26 * 2;
                }
                else {
                  lVar26 = width[lVar33];
                  plo_rem[lVar33] = lVar26;
                  lVar22 = (thi_rem[lVar33] + lVar26) - tlo_rem[lVar33];
                }
              }
              else {
                plo_rem[lVar33] = 0;
                lVar22 = (increment[lVar33] + thi_rem[lVar33]) - tlo_rem[lVar33];
                lVar26 = 0;
              }
              phi_rem[lVar33] = lVar22;
              plo_loc[lVar33] = lVar26;
              lVar33 = lVar33 + 1;
            } while (ndim != lVar33);
            uVar3 = GA[lVar1].ndim;
            uVar32 = (ulong)(short)uVar3;
            iVar18 = GA[lVar1].distr_type;
            if (iVar18 - 1U < 3) {
              uVar25 = lVar14 % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar25;
              if (1 < (short)uVar3) {
                uVar25 = uVar25 & 0xffffffff;
                lVar33 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)uVar25) / GA[g_a + 1000].num_blocks[lVar33];
                  uVar25 = (long)(int)IVar16 % GA[g_a + 1000].num_blocks[lVar33 + 1];
                  _index[lVar33 + 1] = (int)uVar25;
                  lVar33 = lVar33 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar33);
              }
              if (0 < (short)uVar3) {
                lVar33 = 0;
                do {
                  iVar24 = *(int *)((long)_index + lVar33);
                  lVar22 = *(long *)((long)GA[g_a + 1000].block_dims + lVar33 * 2);
                  *(long *)(err_string + lVar33 * 2) = lVar22 * iVar24 + 1;
                  lVar22 = ((long)iVar24 + 1) * lVar22;
                  *(long *)((long)_hi + lVar33 * 2) = lVar22;
                  lVar26 = *(long *)((long)GA[g_a + 1000].dims + lVar33 * 2);
                  if (lVar26 <= lVar22) {
                    lVar22 = lVar26;
                  }
                  *(long *)((long)_hi + lVar33 * 2) = lVar22;
                  lVar33 = lVar33 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar33);
              }
            }
            else if (iVar18 == 4) {
              uVar25 = lVar14 % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar25;
              if (1 < (short)uVar3) {
                uVar25 = uVar25 & 0xffffffff;
                lVar33 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)uVar25) / GA[g_a + 1000].num_blocks[lVar33];
                  uVar25 = (long)(int)IVar16 % GA[g_a + 1000].num_blocks[lVar33 + 1];
                  _index[lVar33 + 1] = (int)uVar25;
                  lVar33 = lVar33 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar33);
              }
              if (0 < (short)uVar3) {
                pCVar10 = GA[lVar1].mapc;
                lVar33 = 0;
                iVar24 = 0;
                do {
                  iVar12 = *(int *)((long)_index + lVar33);
                  lVar22 = (long)iVar24 + (long)iVar12;
                  *(C_Integer *)(err_string + lVar33 * 2) = pCVar10[lVar22];
                  if ((long)iVar12 < *(long *)((long)GA[lVar1].num_blocks + lVar33 * 2) + -1) {
                    lVar22 = GA[lVar1].mapc[lVar22 + 1] + -1;
                  }
                  else {
                    lVar22 = *(long *)((long)GA[lVar1].dims + lVar33 * 2);
                  }
                  *(long *)((long)_hi + lVar33 * 2) = lVar22;
                  iVar24 = iVar24 + *(int *)((long)GA[lVar1].num_blocks + lVar33 * 2);
                  lVar33 = lVar33 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar33);
              }
            }
            else if (iVar18 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if ((short)uVar3 < 1) {
                  lVar33 = 1;
                }
                else {
                  lVar33 = 1;
                  uVar25 = 0;
                  do {
                    lVar33 = lVar33 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                }
                if ((-1 < proc) && (proc < lVar33)) {
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    uVar25 = 0;
                    lVar33 = 0;
                    IVar16 = proc;
                    do {
                      lVar26 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar22 = IVar16 % lVar26;
                      width[uVar25 - 0x20] = pCVar10[lVar22 + lVar33];
                      if (lVar22 == lVar26 + -1) {
                        CVar28 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar28 = pCVar10[lVar22 + lVar33 + 1] + -1;
                      }
                      lVar33 = lVar33 + lVar26;
                      _hi[uVar25] = CVar28;
                      uVar25 = uVar25 + 1;
                      IVar16 = IVar16 / lVar26;
                    } while (uVar32 != uVar25);
                  }
                  goto LAB_0017da62;
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                if ((short)uVar3 < 1) {
                  lVar33 = 1;
                }
                else {
                  lVar33 = 1;
                  uVar25 = 0;
                  do {
                    lVar33 = lVar33 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                }
                if ((-1 < proc) && (proc < lVar33)) {
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    uVar25 = 0;
                    lVar33 = 0;
                    IVar16 = proc;
                    do {
                      lVar26 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar22 = IVar16 % lVar26;
                      width[uVar25 - 0x20] = pCVar10[lVar22 + lVar33];
                      if (lVar22 == lVar26 + -1) {
                        CVar28 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar28 = pCVar10[lVar22 + lVar33 + 1] + -1;
                      }
                      lVar33 = lVar33 + lVar26;
                      _hi[uVar25] = CVar28;
                      uVar25 = uVar25 + 1;
                      IVar16 = IVar16 / lVar26;
                    } while (uVar32 != uVar25);
                  }
                  goto LAB_0017da62;
                }
              }
              if (0 < (short)uVar3) {
                memset(err_string,0,uVar32 * 8);
                memset(_hi,0xff,uVar32 * 8);
              }
            }
LAB_0017da62:
            if (uVar32 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar11[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar22 = 1;
              lVar33 = 0;
            }
            else {
              lVar22 = 1;
              lVar26 = 0;
              lVar33 = 0;
              do {
                lVar33 = lVar33 + plo_loc[lVar26] * lVar22;
                lVar29 = (_hi[lVar26] - width[lVar26 + -0x20]) +
                         pgVar11[g_a + 1000].width[lVar26] * 2 + 1;
                ld_loc[lVar26] = lVar29;
                lVar22 = lVar22 * lVar29;
                lVar26 = lVar26 + 1;
              } while (uVar32 - 1 != lVar26);
            }
            lVar26 = plo_loc[uVar32 - 1];
            ppcVar7 = pgVar11[lVar1].ptr;
            iVar24 = pgVar11[lVar1].elemsize;
            pcVar8 = ppcVar7[proc];
            local_620 = (int)uVar31;
            if (iVar18 - 1U < 3) {
              uVar25 = (long)local_620 % pgVar11[lVar1].num_blocks[0];
              _index[0] = (int)uVar25;
              if (1 < (short)uVar3) {
                uVar25 = uVar25 & 0xffffffff;
                lVar29 = 0;
                uVar17 = uVar31;
                do {
                  uVar17 = (long)((int)uVar17 - (int)uVar25) /
                           pgVar11[g_a + 1000].num_blocks[lVar29];
                  uVar25 = (long)(int)uVar17 % pgVar11[g_a + 1000].num_blocks[lVar29 + 1];
                  _index[lVar29 + 1] = (int)uVar25;
                  lVar29 = lVar29 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar3) {
                lVar29 = 0;
                do {
                  iVar18 = *(int *)((long)_index + lVar29);
                  lVar27 = *(long *)((long)pgVar11[g_a + 1000].block_dims + lVar29 * 2);
                  *(long *)(err_string + lVar29 * 2) = lVar27 * iVar18 + 1;
                  lVar27 = ((long)iVar18 + 1) * lVar27;
                  *(long *)((long)_hi + lVar29 * 2) = lVar27;
                  lVar23 = *(long *)((long)pgVar11[g_a + 1000].dims + lVar29 * 2);
                  if (lVar23 <= lVar27) {
                    lVar27 = lVar23;
                  }
                  *(long *)((long)_hi + lVar29 * 2) = lVar27;
                  lVar29 = lVar29 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar29);
              }
            }
            else if (iVar18 == 4) {
              uVar25 = (long)local_620 % pgVar11[lVar1].num_blocks[0];
              _index[0] = (int)uVar25;
              if (1 < (short)uVar3) {
                uVar25 = uVar25 & 0xffffffff;
                lVar29 = 0;
                uVar17 = uVar31;
                do {
                  uVar17 = (long)((int)uVar17 - (int)uVar25) /
                           pgVar11[g_a + 1000].num_blocks[lVar29];
                  uVar25 = (long)(int)uVar17 % pgVar11[g_a + 1000].num_blocks[lVar29 + 1];
                  _index[lVar29 + 1] = (int)uVar25;
                  lVar29 = lVar29 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar3) {
                pCVar10 = pgVar11[lVar1].mapc;
                lVar29 = 0;
                iVar18 = 0;
                do {
                  iVar12 = *(int *)((long)_index + lVar29);
                  lVar27 = (long)iVar18 + (long)iVar12;
                  *(C_Integer *)(err_string + lVar29 * 2) = pCVar10[lVar27];
                  if ((long)iVar12 < *(long *)((long)pgVar11[lVar1].num_blocks + lVar29 * 2) + -1) {
                    lVar27 = pgVar11[lVar1].mapc[lVar27 + 1] + -1;
                  }
                  else {
                    lVar27 = *(long *)((long)pgVar11[lVar1].dims + lVar29 * 2);
                  }
                  *(long *)((long)_hi + lVar29 * 2) = lVar27;
                  iVar18 = iVar18 + *(int *)((long)pgVar11[lVar1].num_blocks + lVar29 * 2);
                  lVar29 = lVar29 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar29);
              }
            }
            else if (iVar18 == 0) {
              if (pgVar11[lVar1].num_rstrctd == 0) {
                if ((short)uVar3 < 1) {
                  lVar29 = 1;
                }
                else {
                  lVar29 = 1;
                  uVar25 = 0;
                  do {
                    lVar29 = lVar29 * pgVar11[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                }
                if (((long)uVar31 < 0) || (lVar29 <= (long)uVar31)) {
LAB_0017de92:
                  if (0 < (short)uVar3) {
                    memset(err_string,0,uVar32 << 3);
LAB_0017debe:
                    memset(_hi,0xff,uVar32 << 3);
                  }
                }
                else if (0 < (short)uVar3) {
                  pCVar10 = pgVar11[lVar1].mapc;
                  lVar29 = 0;
                  uVar17 = 0;
                  uVar25 = uVar31;
                  do {
                    lVar23 = (long)pgVar11[g_a + 1000].nblock[uVar17];
                    lVar27 = (long)uVar25 % lVar23;
                    width[uVar17 - 0x20] = pCVar10[lVar27 + lVar29];
                    if (lVar27 == lVar23 + -1) {
                      CVar28 = pgVar11[g_a + 1000].dims[uVar17];
                    }
                    else {
                      CVar28 = pCVar10[lVar27 + lVar29 + 1] + -1;
                    }
                    lVar29 = lVar29 + lVar23;
                    _hi[uVar17] = CVar28;
                    uVar17 = uVar17 + 1;
                    uVar25 = (long)uVar25 / lVar23;
                  } while (uVar32 != uVar17);
                }
              }
              else if ((long)uVar31 < pgVar11[lVar1].num_rstrctd) {
                if ((short)uVar3 < 1) {
                  lVar29 = 1;
                }
                else {
                  lVar29 = 1;
                  uVar25 = 0;
                  do {
                    lVar29 = lVar29 * pgVar11[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                }
                if (((long)uVar31 < 0) || (lVar29 <= (long)uVar31)) goto LAB_0017de92;
                if (0 < (short)uVar3) {
                  pCVar10 = pgVar11[lVar1].mapc;
                  lVar29 = 0;
                  uVar17 = 0;
                  uVar25 = uVar31;
                  do {
                    lVar23 = (long)pgVar11[g_a + 1000].nblock[uVar17];
                    lVar27 = (long)uVar25 % lVar23;
                    width[uVar17 - 0x20] = pCVar10[lVar27 + lVar29];
                    if (lVar27 == lVar23 + -1) {
                      CVar28 = pgVar11[g_a + 1000].dims[uVar17];
                    }
                    else {
                      CVar28 = pCVar10[lVar27 + lVar29 + 1] + -1;
                    }
                    lVar29 = lVar29 + lVar23;
                    _hi[uVar17] = CVar28;
                    uVar17 = uVar17 + 1;
                    uVar25 = (long)uVar25 / lVar23;
                  } while (uVar32 != uVar17);
                }
              }
              else if (0 < (short)uVar3) {
                memset(err_string,0,(ulong)uVar3 << 3);
                goto LAB_0017debe;
              }
            }
            if (uVar32 == 1) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar11[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar27 = 1;
              lVar29 = 0;
            }
            else {
              lVar27 = 1;
              lVar23 = 0;
              lVar29 = 0;
              do {
                lVar29 = lVar29 + plo_rem[lVar23] * lVar27;
                lVar30 = (_hi[lVar23] - width[lVar23 + -0x20]) +
                         pgVar11[g_a + 1000].width[lVar23] * 2 + 1;
                ld_rem[lVar23] = lVar30;
                lVar27 = lVar27 * lVar30;
                lVar23 = lVar23 + 1;
              } while (uVar32 - 1 != lVar23);
            }
            lVar23 = plo_rem[uVar32 - 1];
            pcVar9 = ppcVar7[uVar31];
            stride_loc[0] = iVar4;
            stride_rem[0] = iVar4;
            if (sVar2 != 1) {
              lVar30 = 0;
              iVar18 = iVar4;
              iVar12 = iVar4;
              do {
                iVar18 = iVar18 * (int)ld_rem[lVar30];
                stride_rem[lVar30] = iVar18;
                iVar12 = iVar12 * (int)ld_loc[lVar30];
                stride_loc[lVar30] = iVar12;
                stride_rem[lVar30 + 1] = iVar18;
                stride_loc[lVar30 + 1] = iVar12;
                lVar30 = lVar30 + 1;
              } while (lVar21 != lVar30);
            }
            lVar30 = 0;
            do {
              count[lVar30] = ((int)phi_rem[lVar30] - (int)plo_rem[lVar30]) + 1;
              lVar30 = lVar30 + 1;
            } while (ndim != lVar30);
            count[0] = count[0] * iVar4;
            if (-1 < iVar5) {
              uVar31 = (ulong)(uint)PGRP_LIST[grp_id].inv_map_proc_list[uVar31];
            }
            ARMCI_PutS(pcVar8 + (lVar22 * lVar26 + lVar33) * (long)iVar24,stride_loc,
                       pcVar9 + (lVar27 * lVar23 + lVar29) * (long)iVar24,stride_rem,count,
                       (int)lVar20,(int)uVar31);
            get_remote_block_pos(idx,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
            lVar13 = pnga_locate_region(g_a,slo_rem,shi_rem,map,(Integer *)proclist,&np);
            if (lVar13 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar15 = strlen(err_string);
              sprintf(err_string + (int)sVar15," [%ld:%ld ",slo_rem[0],shi_rem[0]);
              sVar15 = strlen(err_string);
              iVar18 = (int)sVar15;
              IVar16 = pnga_ndim(g_a);
              if (1 < IVar16) {
                lVar33 = 1;
                do {
                  sprintf(err_string + (int)sVar15,",%ld:%ld ",slo_rem[lVar33],shi_rem[lVar33]);
                  sVar15 = strlen(err_string);
                  iVar18 = (int)sVar15;
                  lVar33 = lVar33 + 1;
                  IVar16 = pnga_ndim(g_a);
                } while (lVar33 < IVar16);
              }
              (err_string + iVar18)[0] = ']';
              (err_string + iVar18)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            uVar31 = *proclist;
            pnga_distribution(g_a,uVar31,tlo_rem,thi_rem);
            pgVar11 = GA;
            lVar33 = 0;
            do {
              if (increment[lVar33] == 0) {
                if (idx == lVar33) {
                  plo_rem[lVar33] = 0;
                  phi_rem[lVar33] = width[lVar33] + -1;
                  lVar22 = (width[lVar33] + -1 + hi_loc[lVar33]) - lo_loc[lVar33];
                }
                else {
                  lVar22 = width[lVar33];
                  plo_rem[lVar33] = lVar22;
                  phi_rem[lVar33] = (thi_rem[lVar33] + lVar22) - tlo_rem[lVar33];
                }
              }
              else {
                plo_rem[lVar33] = 0;
                phi_rem[lVar33] = (increment[lVar33] + thi_rem[lVar33]) - tlo_rem[lVar33];
                lVar22 = 0;
              }
              plo_loc[lVar33] = lVar22;
              lVar33 = lVar33 + 1;
            } while (ndim != lVar33);
            uVar3 = GA[lVar1].ndim;
            uVar32 = (ulong)(short)uVar3;
            iVar18 = GA[lVar1].distr_type;
            if (iVar18 - 1U < 3) {
              uVar25 = lVar14 % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar25;
              if (1 < (short)uVar3) {
                uVar25 = uVar25 & 0xffffffff;
                lVar33 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)uVar25) / GA[g_a + 1000].num_blocks[lVar33];
                  uVar25 = (long)(int)IVar16 % GA[g_a + 1000].num_blocks[lVar33 + 1];
                  _index[lVar33 + 1] = (int)uVar25;
                  lVar33 = lVar33 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar33);
              }
              if (0 < (short)uVar3) {
                lVar33 = 0;
                do {
                  iVar24 = *(int *)((long)_index + lVar33);
                  lVar22 = *(long *)((long)GA[g_a + 1000].block_dims + lVar33 * 2);
                  *(long *)(err_string + lVar33 * 2) = lVar22 * iVar24 + 1;
                  lVar22 = ((long)iVar24 + 1) * lVar22;
                  *(long *)((long)_hi + lVar33 * 2) = lVar22;
                  lVar26 = *(long *)((long)GA[g_a + 1000].dims + lVar33 * 2);
                  if (lVar26 <= lVar22) {
                    lVar22 = lVar26;
                  }
                  *(long *)((long)_hi + lVar33 * 2) = lVar22;
                  lVar33 = lVar33 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar33);
              }
            }
            else if (iVar18 == 4) {
              uVar25 = lVar14 % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar25;
              if (1 < (short)uVar3) {
                uVar25 = uVar25 & 0xffffffff;
                lVar33 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)uVar25) / GA[g_a + 1000].num_blocks[lVar33];
                  uVar25 = (long)(int)IVar16 % GA[g_a + 1000].num_blocks[lVar33 + 1];
                  _index[lVar33 + 1] = (int)uVar25;
                  lVar33 = lVar33 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar33);
              }
              if (0 < (short)uVar3) {
                pCVar10 = GA[lVar1].mapc;
                lVar33 = 0;
                iVar24 = 0;
                do {
                  iVar12 = *(int *)((long)_index + lVar33);
                  lVar22 = (long)iVar24 + (long)iVar12;
                  *(C_Integer *)(err_string + lVar33 * 2) = pCVar10[lVar22];
                  if ((long)iVar12 < *(long *)((long)GA[lVar1].num_blocks + lVar33 * 2) + -1) {
                    lVar22 = GA[lVar1].mapc[lVar22 + 1] + -1;
                  }
                  else {
                    lVar22 = *(long *)((long)GA[lVar1].dims + lVar33 * 2);
                  }
                  *(long *)((long)_hi + lVar33 * 2) = lVar22;
                  iVar24 = iVar24 + *(int *)((long)GA[lVar1].num_blocks + lVar33 * 2);
                  lVar33 = lVar33 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar33);
              }
            }
            else if (iVar18 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if ((short)uVar3 < 1) {
                  lVar33 = 1;
                }
                else {
                  lVar33 = 1;
                  uVar25 = 0;
                  do {
                    lVar33 = lVar33 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                }
                if ((-1 < proc) && (proc < lVar33)) {
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    lVar33 = 0;
                    uVar25 = 0;
                    IVar16 = proc;
                    do {
                      lVar26 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar22 = IVar16 % lVar26;
                      width[uVar25 - 0x20] = pCVar10[lVar22 + lVar33];
                      if (lVar22 == lVar26 + -1) {
                        CVar28 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar28 = pCVar10[lVar22 + lVar33 + 1] + -1;
                      }
                      lVar33 = lVar33 + lVar26;
                      _hi[uVar25] = CVar28;
                      uVar25 = uVar25 + 1;
                      IVar16 = IVar16 / lVar26;
                    } while (uVar32 != uVar25);
                  }
                  goto LAB_0017e65d;
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                if ((short)uVar3 < 1) {
                  lVar33 = 1;
                }
                else {
                  lVar33 = 1;
                  uVar25 = 0;
                  do {
                    lVar33 = lVar33 * GA[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                }
                if ((-1 < proc) && (proc < lVar33)) {
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    lVar33 = 0;
                    uVar25 = 0;
                    IVar16 = proc;
                    do {
                      lVar26 = (long)GA[g_a + 1000].nblock[uVar25];
                      lVar22 = IVar16 % lVar26;
                      width[uVar25 - 0x20] = pCVar10[lVar22 + lVar33];
                      if (lVar22 == lVar26 + -1) {
                        CVar28 = GA[g_a + 1000].dims[uVar25];
                      }
                      else {
                        CVar28 = pCVar10[lVar22 + lVar33 + 1] + -1;
                      }
                      lVar33 = lVar33 + lVar26;
                      _hi[uVar25] = CVar28;
                      uVar25 = uVar25 + 1;
                      IVar16 = IVar16 / lVar26;
                    } while (uVar32 != uVar25);
                  }
                  goto LAB_0017e65d;
                }
              }
              if (0 < (short)uVar3) {
                memset(err_string,0,uVar32 * 8);
                memset(_hi,0xff,uVar32 * 8);
              }
            }
LAB_0017e65d:
            if (uVar32 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar11[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar22 = 1;
              lVar33 = 0;
            }
            else {
              lVar22 = 1;
              lVar33 = 0;
              lVar26 = 0;
              do {
                lVar33 = lVar33 + plo_loc[lVar26] * lVar22;
                lVar29 = (_hi[lVar26] - width[lVar26 + -0x20]) +
                         pgVar11[g_a + 1000].width[lVar26] * 2 + 1;
                ld_loc[lVar26] = lVar29;
                lVar22 = lVar22 * lVar29;
                lVar26 = lVar26 + 1;
              } while (uVar32 - 1 != lVar26);
            }
            lVar26 = plo_loc[uVar32 - 1];
            ppcVar7 = pgVar11[lVar1].ptr;
            iVar24 = pgVar11[lVar1].elemsize;
            pcVar8 = ppcVar7[proc];
            local_620 = (int)uVar31;
            if (iVar18 - 1U < 3) {
              uVar25 = (long)local_620 % pgVar11[lVar1].num_blocks[0];
              _index[0] = (int)uVar25;
              if (1 < (short)uVar3) {
                uVar25 = uVar25 & 0xffffffff;
                lVar29 = 0;
                uVar17 = uVar31;
                do {
                  uVar17 = (long)((int)uVar17 - (int)uVar25) /
                           pgVar11[g_a + 1000].num_blocks[lVar29];
                  uVar25 = (long)(int)uVar17 % pgVar11[g_a + 1000].num_blocks[lVar29 + 1];
                  _index[lVar29 + 1] = (int)uVar25;
                  lVar29 = lVar29 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar3) {
                lVar29 = 0;
                do {
                  iVar18 = *(int *)((long)_index + lVar29);
                  lVar27 = *(long *)((long)pgVar11[g_a + 1000].block_dims + lVar29 * 2);
                  *(long *)(err_string + lVar29 * 2) = lVar27 * iVar18 + 1;
                  lVar27 = ((long)iVar18 + 1) * lVar27;
                  *(long *)((long)_hi + lVar29 * 2) = lVar27;
                  lVar23 = *(long *)((long)pgVar11[g_a + 1000].dims + lVar29 * 2);
                  if (lVar23 <= lVar27) {
                    lVar27 = lVar23;
                  }
                  *(long *)((long)_hi + lVar29 * 2) = lVar27;
                  lVar29 = lVar29 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar29);
              }
            }
            else if (iVar18 == 4) {
              uVar25 = (long)local_620 % pgVar11[lVar1].num_blocks[0];
              _index[0] = (int)uVar25;
              if (1 < (short)uVar3) {
                uVar25 = uVar25 & 0xffffffff;
                lVar29 = 0;
                uVar17 = uVar31;
                do {
                  uVar17 = (long)((int)uVar17 - (int)uVar25) /
                           pgVar11[g_a + 1000].num_blocks[lVar29];
                  uVar25 = (long)(int)uVar17 % pgVar11[g_a + 1000].num_blocks[lVar29 + 1];
                  _index[lVar29 + 1] = (int)uVar25;
                  lVar29 = lVar29 + 1;
                } while ((uVar32 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar3) {
                pCVar10 = pgVar11[lVar1].mapc;
                lVar29 = 0;
                iVar18 = 0;
                do {
                  iVar12 = *(int *)((long)_index + lVar29);
                  lVar27 = (long)iVar18 + (long)iVar12;
                  *(C_Integer *)(err_string + lVar29 * 2) = pCVar10[lVar27];
                  if ((long)iVar12 < *(long *)((long)pgVar11[lVar1].num_blocks + lVar29 * 2) + -1) {
                    lVar27 = pgVar11[lVar1].mapc[lVar27 + 1] + -1;
                  }
                  else {
                    lVar27 = *(long *)((long)pgVar11[lVar1].dims + lVar29 * 2);
                  }
                  *(long *)((long)_hi + lVar29 * 2) = lVar27;
                  iVar18 = iVar18 + *(int *)((long)pgVar11[lVar1].num_blocks + lVar29 * 2);
                  lVar29 = lVar29 + 4;
                } while ((uVar32 & 0xffffffff) << 2 != lVar29);
              }
            }
            else if (iVar18 == 0) {
              if (pgVar11[lVar1].num_rstrctd == 0) {
                if ((short)uVar3 < 1) {
                  lVar29 = 1;
                }
                else {
                  lVar29 = 1;
                  uVar25 = 0;
                  do {
                    lVar29 = lVar29 * pgVar11[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                }
                if (((long)uVar31 < 0) || (lVar29 <= (long)uVar31)) {
LAB_0017ea7b:
                  if (0 < (short)uVar3) {
                    memset(err_string,0,uVar32 << 3);
LAB_0017eaa6:
                    memset(_hi,0xff,uVar32 << 3);
                  }
                }
                else if (0 < (short)uVar3) {
                  pCVar10 = pgVar11[lVar1].mapc;
                  lVar29 = 0;
                  uVar17 = 0;
                  uVar25 = uVar31;
                  do {
                    lVar23 = (long)pgVar11[g_a + 1000].nblock[uVar17];
                    lVar27 = (long)uVar25 % lVar23;
                    width[uVar17 - 0x20] = pCVar10[lVar27 + lVar29];
                    if (lVar27 == lVar23 + -1) {
                      CVar28 = pgVar11[g_a + 1000].dims[uVar17];
                    }
                    else {
                      CVar28 = pCVar10[lVar27 + lVar29 + 1] + -1;
                    }
                    lVar29 = lVar29 + lVar23;
                    _hi[uVar17] = CVar28;
                    uVar17 = uVar17 + 1;
                    uVar25 = (long)uVar25 / lVar23;
                  } while (uVar32 != uVar17);
                }
              }
              else if ((long)uVar31 < pgVar11[lVar1].num_rstrctd) {
                if ((short)uVar3 < 1) {
                  lVar29 = 1;
                }
                else {
                  lVar29 = 1;
                  uVar25 = 0;
                  do {
                    lVar29 = lVar29 * pgVar11[g_a + 1000].nblock[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar32 != uVar25);
                }
                if (((long)uVar31 < 0) || (lVar29 <= (long)uVar31)) goto LAB_0017ea7b;
                if (0 < (short)uVar3) {
                  pCVar10 = pgVar11[lVar1].mapc;
                  lVar29 = 0;
                  uVar17 = 0;
                  uVar25 = uVar31;
                  do {
                    lVar23 = (long)pgVar11[g_a + 1000].nblock[uVar17];
                    lVar27 = (long)uVar25 % lVar23;
                    width[uVar17 - 0x20] = pCVar10[lVar27 + lVar29];
                    if (lVar27 == lVar23 + -1) {
                      CVar28 = pgVar11[g_a + 1000].dims[uVar17];
                    }
                    else {
                      CVar28 = pCVar10[lVar27 + lVar29 + 1] + -1;
                    }
                    lVar29 = lVar29 + lVar23;
                    _hi[uVar17] = CVar28;
                    uVar17 = uVar17 + 1;
                    uVar25 = (long)uVar25 / lVar23;
                  } while (uVar32 != uVar17);
                }
              }
              else if (0 < (short)uVar3) {
                memset(err_string,0,(ulong)uVar3 << 3);
                goto LAB_0017eaa6;
              }
            }
            if (uVar32 == 1) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar11[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar27 = 1;
              lVar29 = 0;
            }
            else {
              lVar27 = 1;
              lVar29 = 0;
              lVar23 = 0;
              do {
                lVar29 = lVar29 + plo_rem[lVar23] * lVar27;
                lVar30 = (_hi[lVar23] - width[lVar23 + -0x20]) +
                         pgVar11[g_a + 1000].width[lVar23] * 2 + 1;
                ld_rem[lVar23] = lVar30;
                lVar27 = lVar27 * lVar30;
                lVar23 = lVar23 + 1;
              } while (uVar32 - 1 != lVar23);
            }
            lVar23 = plo_rem[uVar32 - 1];
            pcVar9 = ppcVar7[uVar31];
            stride_loc[0] = iVar4;
            stride_rem[0] = iVar4;
            if (sVar2 != 1) {
              lVar30 = 0;
              iVar18 = iVar4;
              iVar12 = iVar4;
              do {
                iVar18 = iVar18 * (int)ld_rem[lVar30];
                stride_rem[lVar30] = iVar18;
                iVar12 = iVar12 * (int)ld_loc[lVar30];
                stride_loc[lVar30] = iVar12;
                stride_rem[lVar30 + 1] = iVar18;
                stride_loc[lVar30 + 1] = iVar12;
                lVar30 = lVar30 + 1;
              } while (lVar21 != lVar30);
            }
            lVar30 = 0;
            do {
              count[lVar30] = ((int)phi_rem[lVar30] - (int)plo_rem[lVar30]) + 1;
              lVar30 = lVar30 + 1;
            } while (ndim != lVar30);
            count[0] = count[0] * iVar4;
            if (-1 < iVar5) {
              uVar31 = (ulong)(uint)PGRP_LIST[grp_id].inv_map_proc_list[uVar31];
            }
            ARMCI_PutS(pcVar8 + (lVar22 * lVar26 + lVar33) * (long)iVar24,stride_loc,
                       pcVar9 + (lVar27 * lVar23 + lVar29) * (long)iVar24,stride_rem,count,
                       (int)lVar20,(int)uVar31);
          }
          if (idx < lVar20) {
            pnga_pgroup_sync(grp_id);
          }
          increment[idx] = lVar6 * 2;
          idx = idx + 1;
        } while (idx != ndim);
      }
      free(map);
      free(proclist);
      lVar19 = 1;
    }
  }
  return lVar19;
}

Assistant:

logical pnga_update3_ghosts(Integer g_a)
{
  Integer idx, i, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer size, ndim, nwidth, increment[MAXDIM];
  Integer width[MAXDIM];
  Integer dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension. This implementation uses simple put
   * operations to perform the updates along each dimension with an
   * intervening synchronization call being used to make sure that the
   * necessary data is available on each processor before starting the
   * update along the next dimension.
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. 
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;

  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) return FALSE;
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update3_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update3_ghosts:malloc failed (_ga_proclist)",0);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {
    nwidth = width[idx];

    /* Do not bother with update if nwidth is zero */
    if (nwidth != 0) {

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired location of remote
         data as well as the actual coordinates of the local chunk
         of data that will be sent to remote processor (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] + 1;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + 2*width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* Put local data on remote processor */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem);

      /* Perform update in positive direction */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired chunk of remote
         data as well as the actual coordinates of the local chunk
         of data that will receive the remote data (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = 0;
            phi_rem[i] = width[i] - 1;
            plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] - 1;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* get remote data */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem);
    }
    /* synchronize all processors and update increment array */
    if (idx < ndim-1) pnga_pgroup_sync(p_handle);
    increment[idx] = 2*nwidth;
  }
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}